

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemSMC.cpp
# Opt level: O2

void __thiscall chrono::ChSystemSMC::ChSystemSMC(ChSystemSMC *this,bool use_material_properties)

{
  element_type *peVar1;
  element_type *peVar2;
  ChContactForceSMC *pCVar3;
  __shared_ptr<chrono::ChContactContainerSMC,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  ChSystem::ChSystem(&this->super_ChSystem);
  (this->super_ChSystem).super_ChIntegrableIIorder.super_ChIntegrable._vptr_ChIntegrable =
       (_func_int **)&PTR_GetNcoords_y_011593c8;
  (this->super_ChSystem).field_0x379 = use_material_properties;
  *(undefined8 *)&(this->super_ChSystem).field_0x37c = 1;
  this->m_tdispl_model = OneStep;
  this->m_stiff_contact = false;
  pCVar3 = (ChContactForceSMC *)::operator_new(8);
  pCVar3->_vptr_ChContactForceSMC = (_func_int **)&PTR__ChContactForceSMC_01159628;
  (this->m_force_algo)._M_t.
  super___uniq_ptr_impl<chrono::ChSystemSMC::ChContactForceSMC,_std::default_delete<chrono::ChSystemSMC::ChContactForceSMC>_>
  ._M_t.
  super__Tuple_impl<0UL,_chrono::ChSystemSMC::ChContactForceSMC_*,_std::default_delete<chrono::ChSystemSMC::ChContactForceSMC>_>
  .super__Head_base<0UL,_chrono::ChSystemSMC::ChContactForceSMC_*,_false>._M_head_impl = pCVar3;
  std::make_shared<chrono::ChSystemDescriptor>();
  std::__shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChSystem).descriptor.
              super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  ChSystem::SetSolverType(&this->super_ChSystem,PSOR);
  std::make_shared<chrono::collision::ChCollisionSystemBullet>();
  std::__shared_ptr<chrono::collision::ChCollisionSystem,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::collision::ChCollisionSystem,(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ChSystem).collision_system,
             (__shared_ptr<chrono::collision::ChCollisionSystemBullet,_(__gnu_cxx::_Lock_policy)2> *
             )&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  peVar1 = (this->super_ChSystem).collision_system.
           super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_ChCollisionSystem[0xd])
            (peVar1,(ulong)(uint)(this->super_ChSystem).nthreads_collision);
  ((this->super_ChSystem).collision_system.
   super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_system = &this->super_ChSystem;
  (this->super_ChSystem).collision_system_type = BULLET;
  collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.0);
  std::make_shared<chrono::ChContactContainerSMC>();
  std::__shared_ptr<chrono::ChContactContainer,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChContactContainer,(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ChSystem).contact_container,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  peVar2 = (this->super_ChSystem).contact_container.
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[6])(peVar2,this);
  this->m_minSlipVelocity = 0.0001;
  this->m_characteristicVelocity = 1.0;
  return;
}

Assistant:

ChSystemSMC::ChSystemSMC(bool use_material_properties)
    : ChSystem(),
      m_use_mat_props(use_material_properties),
      m_contact_model(Hertz),
      m_adhesion_model(AdhesionForceModel::Constant),
      m_tdispl_model(OneStep),
      m_stiff_contact(false),
      m_force_algo(new ChDefaultContactForceSMC) {
    descriptor = chrono_types::make_shared<ChSystemDescriptor>();

    SetSolverType(ChSolver::Type::PSOR);

    collision_system = chrono_types::make_shared<collision::ChCollisionSystemBullet>();
    collision_system->SetNumThreads(nthreads_collision);
    collision_system->SetSystem(this);
    collision_system_type = collision::ChCollisionSystemType::BULLET;

    // For default SMC there is no need to create contacts 'in advance'
    // when models are closer than the safety envelope, so set default envelope to 0
    collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0);

    contact_container = chrono_types::make_shared<ChContactContainerSMC>();
    contact_container->SetSystem(this);

    m_minSlipVelocity = 1e-4;
    m_characteristicVelocity = 1;
}